

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.h
# Opt level: O1

int __thiscall
Nova::Boundary_Uniform<float,_3>::Boundary_Side
          (Boundary_Uniform<float,_3> *this,int side,Range<int,_3> *region)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = side / 2;
  if ((side & 1U) == 0) {
    if (2 < uVar2) {
LAB_0011ba60:
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar2,3);
    }
    region = (Range<int,_3> *)&region->max_corner;
    iVar1 = 1;
  }
  else {
    iVar1 = -1;
    if (2 < uVar2) goto LAB_0011ba60;
  }
  return iVar1 + (region->min_corner)._data._M_elems[(int)uVar2];
}

Assistant:

int Boundary_Side(const int side,const Range<int,d>& region) const
    {int axis=side/2;return (side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;}